

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O3

RealType __thiscall
OpenMD::RestraintForceModifier::doRestraints(RestraintForceModifier *this,RealType scalingFactor)

{
  long *plVar1;
  undefined8 *puVar2;
  double dVar3;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *p_Var4;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *p_Var5;
  StuntDouble *pSVar6;
  Snapshot *pSVar7;
  DataStoragePointer DVar8;
  undefined1 auVar9 [8];
  Atom **ppAVar10;
  uint i_2;
  long lVar11;
  Molecule *pMVar12;
  string *psVar13;
  ObjectRestraint *this_00;
  uint i;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  pointer ppSVar15;
  long lVar16;
  long lVar17;
  RotMat3x3d *pRVar18;
  Atom **ppAVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer ppMVar20;
  byte bVar21;
  Vector3d molCom;
  RotMat3x3d A;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> struc;
  MolecularRestraint *local_1d8;
  undefined1 local_1c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  pointer local_1b8;
  Atom **local_1a8;
  pointer ppBStack_1a0;
  Atom *local_198;
  _Base_ptr local_190;
  _Base_ptr p_Stack_188;
  pointer local_180;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_158;
  pointer local_138;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  local_130;
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  *local_100;
  Atom *local_f8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_f0;
  Vector3d local_d8;
  Vector3d local_b8;
  Vector3d local_98;
  RotMat3x3d local_78;
  
  bVar21 = 0;
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->unscaledPotential_ = 0.0;
  p_Var4 = &((this->restInfo_).
             super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var5 = &((this->restInfo_).
             super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_01 = p_Var4;
  local_138 = (pointer)scalingFactor;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 != p_Var4) {
    do {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::~_Rb_tree(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != p_Var5);
    (this->restInfo_).
    super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var4;
  }
  local_100 = &this->restInfo_;
  ppMVar20 = (this->restrainedMols_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppMVar20 ==
      (this->restrainedMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_1d8 = (MolecularRestraint *)0x0;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      pMVar12 = *ppMVar20;
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Restraint","");
      Molecule::getPropertyByName((Molecule *)local_1c8,(string *)pMVar12);
      this_02 = p_Stack_1c0;
      auVar9 = local_1c8;
      local_1c8 = (undefined1  [8])0x0;
      p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14),
         p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,
                        (ulong)((long)&(local_198->super_StuntDouble)._vptr_StuntDouble + 1));
      }
      if (auVar9 == (undefined1  [8])0x0) {
        builtin_strncpy(painCave.errMsg + 0x23,"edObject\n",10);
        builtin_strncpy(painCave.errMsg + 0x10,"traint for Restrain",0x13);
        builtin_strncpy(painCave.errMsg,"Can not find Res",0x10);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      else {
        lVar11 = __dynamic_cast(auVar9,&GenericData::typeinfo,
                                &SimpleTypeData<OpenMD::Restraint*>::typeinfo,0);
        if (lVar11 == 0) {
          builtin_strncpy(painCave.errMsg + 0x23,"ntData\n",8);
          builtin_strncpy(painCave.errMsg + 0x10,"ericData to Restrai",0x13);
          builtin_strncpy(painCave.errMsg,"Can not cast Gen",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_02->_M_use_count = this_02->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_02->_M_use_count = this_02->_M_use_count + 1;
            }
          }
          if ((*(long *)(lVar11 + 0x28) == 0) ||
             (local_1d8 = (MolecularRestraint *)
                          __dynamic_cast(*(long *)(lVar11 + 0x28),&Restraint::typeinfo,
                                         &MolecularRestraint::typeinfo,0),
             local_1d8 == (MolecularRestraint *)0x0)) {
            builtin_strncpy(painCave.errMsg,"Can not cast RestraintData to MolecularRestraint\n",
                            0x32);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
            local_1d8 = (MolecularRestraint *)0x0;
          }
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
        }
      }
      Molecule::getCom((Vector3d *)local_1c8,*ppMVar20);
      local_158.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pMVar12 = *ppMVar20;
      for (ppSVar15 = (pMVar12->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar15 !=
           (pMVar12->integrableObjects_).
           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl
           .super__Vector_impl_data._M_finish && (pSVar6 = *ppSVar15, pSVar6 != (StuntDouble *)0x0))
          ; ppSVar15 = ppSVar15 + 1) {
        psVar13 = (string *)
                  ((long)pSVar6->localIndex_ * 0x18 +
                  *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_));
        local_1a8 = (Atom **)0x0;
        ppBStack_1a0 = (pointer)0x0;
        local_198 = (Atom *)0x0;
        if (psVar13 != (string *)&local_1a8) {
          lVar11 = 0;
          do {
            (&local_1a8)[lVar11] = *(Atom ***)(psVar13 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
        }
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   &local_158,(Vector3<double> *)&local_1a8);
        pMVar12 = *ppMVar20;
      }
      (local_1d8->super_Restraint).scaleFactor_ = (RealType)local_138;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                (&local_f0,&local_158);
      local_98.super_Vector<double,_3U>.data_[2] = (double)local_1b8;
      local_98.super_Vector<double,_3U>.data_[0] = (double)local_1c8;
      local_98.super_Vector<double,_3U>.data_[1] = (double)p_Stack_1c0;
      MolecularRestraint::calcForce(local_1d8,&local_f0,&local_98);
      if (local_f0.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_f0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 &local_1a8,&local_1d8->forces_);
      ppAVar10 = local_1a8;
      local_f8 = local_198;
      ppSVar15 = ((*ppMVar20)->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar15 !=
          ((*ppMVar20)->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar6 = *ppSVar15;
        ppAVar19 = local_1a8;
        while (pSVar6 != (StuntDouble *)0x0) {
          pSVar7 = pSVar6->snapshotMan_->currentSnapshot_;
          lVar11 = (long)pSVar6->localIndex_ * 0x18;
          lVar16 = *(long *)((long)&(pSVar7->atomData).force.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_) +
                   lVar11;
          lVar17 = 0;
          do {
            *(double *)(lVar16 + lVar17 * 8) =
                 (double)ppAVar19[lVar17] + *(double *)(lVar16 + lVar17 * 8);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          psVar13 = (string *)
                    (lVar11 + *(long *)((long)&(pSVar7->atomData).position.
                                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                       pSVar6->storage_));
          local_1a8 = (Atom **)0x0;
          ppBStack_1a0 = (pointer)0x0;
          local_198 = (Atom *)0x0;
          if (psVar13 != (string *)&local_1a8) {
            lVar11 = 0;
            do {
              (&local_1a8)[lVar11] = *(Atom ***)(psVar13 + lVar11 * 8);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
          }
          std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
          emplace_back<OpenMD::Vector3<double>>
                    ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                     &local_158,(Vector3<double> *)&local_1a8);
          ppSVar15 = ppSVar15 + 1;
          if (ppSVar15 ==
              ((*ppMVar20)->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          ppAVar19 = ppAVar19 + 3;
          pSVar6 = *ppSVar15;
        }
      }
      this->unscaledPotential_ = (local_1d8->super_Restraint).pot_ + this->unscaledPotential_;
      if ((local_1d8->super_Restraint).printRest_ == true) {
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                    *)&local_1a8,&(local_1d8->super_Restraint).restInfo_._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::clear(&local_130);
        if (local_198 != (Atom *)0x0) {
          local_130._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)ppBStack_1a0;
          local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_198;
          local_130._M_impl.super__Rb_tree_header._M_header._M_left = local_190;
          local_130._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_188;
          *(_Rb_tree_header **)&(local_198->super_StuntDouble).objType_ =
               &local_130._M_impl.super__Rb_tree_header;
          local_130._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_180;
          local_198 = (Atom *)0x0;
          local_190 = (_Base_ptr)&ppBStack_1a0;
          local_180 = (pointer)0x0;
          p_Stack_188 = local_190;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                     *)&local_1a8);
        std::
        vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
        ::push_back(local_100,(value_type *)&local_130);
      }
      if (ppAVar10 != (Atom **)0x0) {
        operator_delete(ppAVar10,(long)local_f8 - (long)ppAVar10);
      }
      if (local_158.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_158.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppMVar20 = ppMVar20 + 1;
      p_Var14 = this_02;
    } while (ppMVar20 !=
             (this->restrainedMols_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppSVar15 = (this->restrainedObjs_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar15 !=
      (this->restrainedObjs_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (ObjectRestraint *)0x0;
    p_Var14 = this_02;
    do {
      pSVar6 = *ppSVar15;
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Restraint","");
      StuntDouble::getPropertyByName((StuntDouble *)local_1c8,(string *)pSVar6);
      this_02 = p_Stack_1c0;
      auVar9 = local_1c8;
      local_1c8 = (undefined1  [8])0x0;
      p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14),
         p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,
                        (ulong)((long)&(local_198->super_StuntDouble)._vptr_StuntDouble + 1));
      }
      if (auVar9 == (undefined1  [8])0x0) {
        builtin_strncpy(painCave.errMsg + 0x23,"edObject\n",10);
        builtin_strncpy(painCave.errMsg + 0x10,"traint for Restrain",0x13);
        builtin_strncpy(painCave.errMsg,"Can not find Res",0x10);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      else {
        lVar11 = __dynamic_cast(auVar9,&GenericData::typeinfo,
                                &SimpleTypeData<OpenMD::Restraint*>::typeinfo,0);
        if (lVar11 == 0) {
          builtin_strncpy(painCave.errMsg + 0x23,"ntData\n",8);
          builtin_strncpy(painCave.errMsg + 0x10,"ericData to Restrai",0x13);
          builtin_strncpy(painCave.errMsg,"Can not cast Gen",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_02->_M_use_count = this_02->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_02->_M_use_count = this_02->_M_use_count + 1;
            }
          }
          if ((*(long *)(lVar11 + 0x28) == 0) ||
             (this_00 = (ObjectRestraint *)
                        __dynamic_cast(*(long *)(lVar11 + 0x28),&Restraint::typeinfo,
                                       &ObjectRestraint::typeinfo,0),
             this_00 == (ObjectRestraint *)0x0)) {
            builtin_strncpy(painCave.errMsg + 0x23,"tRestraint\n",0xc);
            builtin_strncpy(painCave.errMsg + 0x10,"traintData to Objec",0x13);
            builtin_strncpy(painCave.errMsg,"Can not cast Res",0x10);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
            this_00 = (ObjectRestraint *)0x0;
          }
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
        }
      }
      (this_00->super_Restraint).scaleFactor_ = (RealType)local_138;
      pSVar6 = *ppSVar15;
      lVar16 = (long)pSVar6->localIndex_;
      lVar11 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
      local_1b8 = *(pointer *)(lVar11 + 0x10 + lVar16 * 0x18);
      plVar1 = (long *)(lVar11 + lVar16 * 0x18);
      local_1c8 = (undefined1  [8])*plVar1;
      p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[1];
      if (pSVar6->objType_ - otDAtom < 2) {
        StuntDouble::getA((RotMat3x3d *)&local_1a8,pSVar6);
        local_b8.super_Vector<double,_3U>.data_[2] = (double)local_1b8;
        local_b8.super_Vector<double,_3U>.data_[0] = (double)local_1c8;
        local_b8.super_Vector<double,_3U>.data_[1] = (double)p_Stack_1c0;
        psVar13 = (string *)&local_1a8;
        pRVar18 = &local_78;
        for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pRVar18->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
               *(double *)psVar13;
          psVar13 = psVar13 + (ulong)bVar21 * -0x10 + 8;
          pRVar18 = (RotMat3x3d *)((long)pRVar18 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        ObjectRestraint::calcForce(this_00,&local_b8,&local_78);
        pSVar6 = *ppSVar15;
        local_158.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(this_00->force_).super_Vector<double,_3U>.data_[2];
        local_158.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(this_00->force_).super_Vector<double,_3U>.data_[0];
        local_158.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)(this_00->force_).super_Vector<double,_3U>.data_[1];
        DVar8 = pSVar6->storage_;
        pSVar7 = pSVar6->snapshotMan_->currentSnapshot_;
        lVar11 = (long)pSVar6->localIndex_ * 0x18;
        lVar16 = *(long *)((long)&(pSVar7->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + DVar8) + lVar11;
        lVar17 = 0;
        do {
          *(double *)(lVar16 + lVar17 * 8) =
               (double)(&local_158.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)[lVar17] +
               *(double *)(lVar16 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        local_158.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(this_00->torque_).super_Vector<double,_3U>.data_[2];
        local_158.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(this_00->torque_).super_Vector<double,_3U>.data_[0];
        local_158.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)(this_00->torque_).super_Vector<double,_3U>.data_[1];
        lVar11 = lVar11 + *(long *)((long)&(pSVar7->atomData).torque.
                                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + DVar8);
        lVar16 = 0;
        do {
          *(double *)(lVar11 + lVar16 * 8) =
               (double)(&local_158.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)[lVar16] +
               *(double *)(lVar11 + lVar16 * 8);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
      }
      else {
        puVar2 = (undefined8 *)(lVar11 + lVar16 * 0x18);
        local_d8.super_Vector<double,_3U>.data_[0] = (double)*puVar2;
        local_d8.super_Vector<double,_3U>.data_[1] = (double)puVar2[1];
        local_d8.super_Vector<double,_3U>.data_[2] = (double)puVar2[2];
        ObjectRestraint::calcForce(this_00,&local_d8);
        pSVar6 = *ppSVar15;
        local_198 = (Atom *)(this_00->force_).super_Vector<double,_3U>.data_[2];
        local_1a8 = (Atom **)(this_00->force_).super_Vector<double,_3U>.data_[0];
        ppBStack_1a0 = (pointer)(this_00->force_).super_Vector<double,_3U>.data_[1];
        lVar11 = (long)pSVar6->localIndex_ * 0x18 +
                 *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
        lVar16 = 0;
        do {
          *(double *)(lVar11 + lVar16 * 8) =
               (double)(&local_1a8)[lVar16] + *(double *)(lVar11 + lVar16 * 8);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
      }
      this->unscaledPotential_ = (this_00->super_Restraint).pot_ + this->unscaledPotential_;
      if ((this_00->super_Restraint).printRest_ == true) {
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                    *)&local_1a8,&(this_00->super_Restraint).restInfo_._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::clear(&local_130);
        if (local_198 != (Atom *)0x0) {
          local_130._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)ppBStack_1a0;
          local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_198;
          local_130._M_impl.super__Rb_tree_header._M_header._M_left = local_190;
          local_130._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_188;
          *(_Rb_tree_header **)&(local_198->super_StuntDouble).objType_ =
               &local_130._M_impl.super__Rb_tree_header;
          local_130._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_180;
          local_198 = (Atom *)0x0;
          local_190 = (_Base_ptr)&ppBStack_1a0;
          local_180 = (pointer)0x0;
          p_Stack_188 = local_190;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                     *)&local_1a8);
        std::
        vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
        ::push_back(local_100,(value_type *)&local_130);
      }
      ppSVar15 = ppSVar15 + 1;
      p_Var14 = this_02;
    } while (ppSVar15 !=
             (this->restrainedObjs_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  dVar3 = this->unscaledPotential_;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  ::~_Rb_tree(&local_130);
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  return dVar3 * (double)local_138;
}

Assistant:

RealType RestraintForceModifier::doRestraints(RealType scalingFactor) {
    std::vector<Molecule*>::const_iterator rm;
    std::shared_ptr<GenericData> data;
    Molecule::IntegrableObjectIterator ioi;
    MolecularRestraint* mRest = NULL;
    ObjectRestraint* oRest    = NULL;
    StuntDouble* sd;

    std::vector<StuntDouble*>::const_iterator ro;

    std::map<int, Restraint::RealPair> restInfo;

    unscaledPotential_ = 0.0;

    restInfo_.clear();

    for (rm = restrainedMols_.begin(); rm != restrainedMols_.end(); ++rm) {
      // make sure this molecule (*rm) has a generic data for restraints:
      data = (*rm)->getPropertyByName("Restraint");
      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a
          // MolecularRestraint
          mRest = dynamic_cast<MolecularRestraint*>(restData->getData());
          if (mRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to MolecularRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct MolecularRestraint in the variable mRest.

      Vector3d molCom = (*rm)->getCom();

      std::vector<Vector3d> struc;
      std::vector<Vector3d> forces;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        struc.push_back(sd->getPos());
      }

      mRest->setScaleFactor(scalingFactor);
      mRest->calcForce(struc, molCom);
      forces    = mRest->getRestraintForces();
      int index = 0;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        sd->addFrc(forces[index]);
        struc.push_back(sd->getPos());
        index++;
      }

      unscaledPotential_ += mRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (mRest->getPrintRestraint()) {
        restInfo = mRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    for (ro = restrainedObjs_.begin(); ro != restrainedObjs_.end(); ++ro) {
      // make sure this object (*ro) has a generic data for restraints:
      data = (*ro)->getPropertyByName("Restraint");
      if (data != NULL) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a pointer to
          // an ObjectRestraint:
          oRest = dynamic_cast<ObjectRestraint*>(restData->getData());
          if (oRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to ObjectRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct Object restraint in the variable oRest.
      oRest->setScaleFactor(scalingFactor);

      Vector3d pos = (*ro)->getPos();

      if ((*ro)->isDirectional()) {
        // directional objects may have orientational restraints as well
        // as positional, so get the rotation matrix first:

        RotMat3x3d A = (*ro)->getA();
        oRest->calcForce(pos, A);
        (*ro)->addFrc(oRest->getRestraintForce());
        (*ro)->addTrq(oRest->getRestraintTorque());

      } else {
        // plain vanilla positional restraints:

        oRest->calcForce(pos);
        (*ro)->addFrc(oRest->getRestraintForce());
      }

      unscaledPotential_ += oRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (oRest->getPrintRestraint()) {
        restInfo = oRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    return unscaledPotential_ * scalingFactor;
  }